

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O3

ON_SubDSectorId ON_SubDSectorId::Create(ON_SubDVertex *vertex,ON_SubDFace *face)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  ON_SubDSectorId *pOVar7;
  undefined8 uVar8;
  ON_SubDEdge *pOVar9;
  ON_SubDEdge *pOVar10;
  ON_SubDVertex *pOVar11;
  ON_SubDFace *pOVar12;
  short sVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  ON_SubDSectorIterator *pOVar17;
  ON_SubDSectorIterator *pOVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  byte bVar23;
  ON_SubDSectorId OVar24;
  ON_SubDComponentPtrPair pair;
  ON_SubDSectorIterator sit0;
  ON_SubDSectorIterator sit1;
  undefined1 local_e0 [8];
  ON_SubDComponentPtrPair local_d8;
  ON_SubDSectorIterator local_c8;
  ON_SubDSectorIterator local_78;
  
  bVar23 = 0;
  local_e0._0_4_ = 0;
  local_e0._4_4_ = 0;
  if (vertex == (ON_SubDVertex *)0x0 || face != (ON_SubDFace *)0x0) {
LAB_006161e7:
    if (vertex != (ON_SubDVertex *)0x0 && face != (ON_SubDFace *)0x0) {
      if (((((vertex->super_ON_SubDComponentBase).m_id + 1 < 2) ||
           ((face->super_ON_SubDComponentBase).m_id + 1 < 2)) || (face->m_edge_count < 3)) ||
         (((vertex->m_edge_count < 2 || (vertex->m_face_count == 0)) ||
          (uVar6 = ON_SubDFace::VertexIndex(face,vertex), face->m_edge_count <= uVar6)))) {
LAB_0061621e:
        pOVar7 = &Invalid;
        uVar15 = Invalid.m_sector_face_count;
      }
      else {
        uVar3 = (vertex->super_ON_SubDComponentBase).m_id;
        uVar22 = (face->super_ON_SubDComponentBase).m_id;
        local_e0._4_4_ = uVar22;
        local_e0._0_4_ = uVar3;
        uVar1 = vertex->m_face_count;
        bVar5 = ON_SubDVertex::IsSmoothOrDart(vertex);
        if (bVar5) {
          uVar15 = 0;
          if ((1 < uVar1) && (uVar1 == vertex->m_edge_count)) {
            bVar5 = ON_SubDVertex::IsDart(vertex);
            uVar6 = (uint)bVar5;
            sVar13 = (ushort)bVar5 + (ushort)bVar5;
LAB_006162c2:
            if ((ulong)vertex->m_edge_count == 0) {
              uVar16 = 0;
            }
            else {
              uVar19 = 0;
              uVar16 = 0;
              do {
                uVar20 = vertex->m_edges[uVar19].m_ptr & 0xfffffffffffffff8;
                uVar8 = Invalid._0_8_;
                uVar15 = Invalid.m_sector_face_count;
                if (((uVar20 == 0) || (sVar2 = *(short *)(uVar20 + 100), sVar2 == 0)) ||
                   (uVar21 = *(ulong *)(uVar20 + 0x68) & 0xfffffffffffffff8, uVar21 == 0))
                goto LAB_0061622b;
                uVar4 = *(uint *)(uVar21 + 8);
                if (uVar4 < uVar22) {
                  uVar22 = uVar4;
                }
                if (*(char *)(uVar20 + 0x60) == '\x02') {
                  uVar16 = uVar16 + 1;
                  if ((uVar6 < uVar16) || (sVar2 != sVar13)) goto LAB_0061622b;
                  if (sVar13 != 1) goto LAB_00616330;
                }
                else {
LAB_00616330:
                  if ((sVar2 != 2) ||
                     (uVar20 = *(ulong *)(uVar20 + 0x70) & 0xfffffffffffffff8, uVar20 == 0))
                  goto LAB_0061622b;
                  uVar15 = *(uint *)(uVar20 + 8);
                  if (uVar15 < uVar22) {
                    uVar22 = uVar15;
                  }
                }
                uVar19 = uVar19 + 1;
              } while (vertex->m_edge_count != uVar19);
            }
            local_e0._4_4_ = uVar22;
            uVar15 = 0;
            if (uVar16 == uVar6) {
              uVar15 = (uint)uVar1;
            }
          }
        }
        else {
          bVar5 = ON_SubDVertex::IsCreaseOrCorner(vertex);
          uVar15 = 0;
          if (bVar5) {
            if ((uVar1 + 1 == (uint)vertex->m_edge_count) &&
               (uVar16 = ON_SubDVertex::CreasedEdgeCount(vertex,true,true,true,false), uVar16 == 2))
            {
              local_d8 = ON_SubDVertex::BoundaryEdgePair(vertex);
            }
            else {
              local_d8.m_pair[1].m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
              local_d8.m_pair[0].m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
            }
            bVar5 = ON_SubDComponentPtrPair::BothAreNotNull(&local_d8);
            if (bVar5) {
              local_c8.m_center_vertex = (ON_SubDVertex *)ON_SubDComponentPtrPair::First(&local_d8);
              pOVar9 = ON_SubDComponentPtr::Edge((ON_SubDComponentPtr *)&local_c8);
              local_78.m_center_vertex = (ON_SubDVertex *)ON_SubDComponentPtrPair::Second(&local_d8)
              ;
              pOVar10 = ON_SubDComponentPtr::Edge((ON_SubDComponentPtr *)&local_78);
              if (((pOVar10 != (ON_SubDEdge *)0x0 && pOVar9 != (ON_SubDEdge *)0x0) &&
                  (pOVar9->m_face_count == 1)) && (pOVar10->m_face_count == 1)) {
                sVar13 = 1;
                uVar6 = 2;
                goto LAB_006162c2;
              }
            }
            else {
              bVar5 = ON_SubDVertex::IsCrease(vertex);
              if ((bVar5) &&
                 (uVar8 = Invalid._0_8_, uVar15 = Invalid.m_sector_face_count,
                 uVar1 != vertex->m_edge_count)) goto LAB_0061622b;
              local_c8.m_current_fei[0] = 0;
              local_c8.m_current_fei[1] = 0;
              local_c8.m_initial_face_dir = 0;
              local_c8.m_current_face_dir = 0;
              local_c8.m_current_eptr[1].m_ptr = 0;
              local_c8.m_initial_fvi = 0;
              local_c8.m_current_fvi = 0;
              local_c8.m_current_face = (ON_SubDFace *)0x0;
              local_c8.m_current_eptr[0].m_ptr = 0;
              local_c8.m_center_vertex = (ON_SubDVertex *)0x0;
              local_c8.m_initial_face = (ON_SubDFace *)0x0;
              local_c8.m_current_ring_index = 0;
              pOVar11 = ON_SubDSectorIterator::Initialize(&local_c8,face,0,uVar6);
              uVar8 = Invalid._0_8_;
              uVar15 = Invalid.m_sector_face_count;
              if (pOVar11 != vertex) goto LAB_0061622b;
              pOVar17 = &local_c8;
              pOVar18 = &local_78;
              for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
                pOVar18->m_center_vertex = pOVar17->m_center_vertex;
                pOVar17 = (ON_SubDSectorIterator *)((long)pOVar17 + (ulong)bVar23 * -0x10 + 8);
                pOVar18 = (ON_SubDSectorIterator *)((long)pOVar18 + ((ulong)bVar23 * -2 + 1) * 8);
              }
              uVar15 = 1;
              pOVar12 = ON_SubDSectorIterator::IncrementFace(&local_c8,1,AnyCrease);
              if (pOVar12 != (ON_SubDFace *)0x0) {
                uVar15 = 1;
                do {
                  if (vertex->m_face_count < uVar15) break;
                  uVar15 = uVar15 + 1;
                  uVar6 = (pOVar12->super_ON_SubDComponentBase).m_id;
                  if (uVar6 < uVar22) {
                    uVar22 = uVar6;
                  }
                  pOVar12 = ON_SubDSectorIterator::IncrementFace(&local_c8,1,AnyCrease);
                } while (pOVar12 != (ON_SubDFace *)0x0);
              }
              pOVar12 = ON_SubDSectorIterator::IncrementFace(&local_78,-1,AnyCrease);
              if (pOVar12 != (ON_SubDFace *)0x0) {
                do {
                  if (vertex->m_face_count < uVar15) break;
                  uVar15 = uVar15 + 1;
                  uVar6 = (pOVar12->super_ON_SubDComponentBase).m_id;
                  if (uVar6 < uVar22) {
                    uVar22 = uVar6;
                  }
                  pOVar12 = ON_SubDSectorIterator::IncrementFace(&local_78,-1,AnyCrease);
                } while (pOVar12 != (ON_SubDFace *)0x0);
              }
              local_e0._4_4_ = uVar22;
            }
          }
        }
        if ((((uVar3 == 0) || (uVar22 == 0)) ||
            ((0xffff < uVar15 || uVar22 == 0xffffffff) || (uVar3 == 0xffffffff || uVar15 == 0))) ||
           (vertex->m_face_count < uVar15)) goto LAB_0061621e;
        pOVar7 = (ON_SubDSectorId *)local_e0;
      }
      uVar8._0_4_ = pOVar7->m_vertex_id;
      uVar8._4_4_ = pOVar7->m_minimum_face_id;
      goto LAB_0061622b;
    }
  }
  else {
    bVar5 = ON_SubDVertex::IsSingleSectorVertex(vertex);
    if (bVar5) {
      face = ON_SubDVertex::Face(vertex,0);
      goto LAB_006161e7;
    }
  }
  uVar8._0_4_ = 0;
  uVar8._4_4_ = 0;
  uVar15 = 0xffffffff;
LAB_0061622b:
  OVar24.m_sector_face_count = uVar15;
  OVar24.m_vertex_id = (uint)uVar8;
  OVar24.m_minimum_face_id = SUB84(uVar8,4);
  return OVar24;
}

Assistant:

const ON_SubDSectorId ON_SubDSectorId::Create(
  const ON_SubDVertex* vertex,
  const ON_SubDFace* face
)
{
  ON_SubDSectorId sid;

  if (nullptr == face && nullptr != vertex && vertex->IsSingleSectorVertex())
    face = vertex->Face(0);

  if (nullptr == vertex || nullptr == face)
  {
    // Creation of ON_SubDSectorId::Invalid in opennurbs_statics.cpp or 
    // just another invalid input.
    sid.m_vertex_id = 0;
    sid.m_minimum_face_id = 0;
    sid.m_sector_face_count = 0xFFFFFFFFU;
    return sid;
  }

  for (;;)
  {
    if (vertex->m_id <= 0 || vertex->m_id >= ON_UNSET_UINT_INDEX)
      break;
    if (face->m_id <= 0 || face->m_id >= ON_UNSET_UINT_INDEX)
      break;
    if (face->m_edge_count < 3)
      break;
    if (vertex->m_edge_count < 2)
      break;
    if (vertex->m_face_count < 1)
      break;
    const unsigned face_vi = face->VertexIndex(vertex);
    if (face_vi >= face->m_edge_count)
      break;

    sid.m_vertex_id = vertex->m_id;
    sid.m_minimum_face_id = face->m_id;
    const unsigned short n = vertex->m_face_count;
    unsigned short crease_face_count = 0;
    unsigned int expected_crease_count = 0;
    if (vertex->IsSmoothOrDart())
    {
      if (n < 2 || n != vertex->m_edge_count)
        break;
      const bool bIsDart = vertex->IsDart();
      crease_face_count = bIsDart ? 2 : 0;
      expected_crease_count = bIsDart ? 1 : 0;
    }
    else if ( vertex->IsCreaseOrCorner())
    {
      const ON_SubDComponentPtrPair pair 
        = (n + 1 == vertex->m_edge_count && 2==vertex->CreasedEdgeCount(true,true,true,false))
          ? vertex->BoundaryEdgePair()
          : ON_SubDComponentPtrPair::Null;
      if (pair.BothAreNotNull())
      {
        // we can avoid using a sector iterator
        const ON_SubDEdge* e[2] = { pair.First().Edge(),pair.Second().Edge() };
        if (nullptr == e[0] || nullptr == e[1])
          break;
        if (1 != e[0]->m_face_count || 1 != e[1]->m_face_count)
          break;
        crease_face_count = 1;
        expected_crease_count = 2;
      }
      else
      {
        if (vertex->IsCrease())
        {
          if (n != vertex->m_edge_count)
            return ON_SubDSectorId::Invalid;
        }

        // complicated case needs to use more time consuming sector iterator 
        ON_SubDSectorIterator sit0;
        if ( vertex != sit0.Initialize(face, 0, face_vi))
          return ON_SubDSectorId::Invalid;
        ON_SubDSectorIterator sit1(sit0);
        // advance sit0 until we hit a crease;
        sid.m_sector_face_count = 1;
        for (const ON_SubDFace* f = sit0.NextFace(ON_SubDSectorIterator::StopAt::AnyCrease); nullptr != f && sid.m_sector_face_count <= vertex->m_face_count; f = sit0.NextFace(ON_SubDSectorIterator::StopAt::AnyCrease))
        {
          ++sid.m_sector_face_count;
          if (f->m_id < sid.m_minimum_face_id)
            sid.m_minimum_face_id = f->m_id;
        }
        // advance sit1 until we hit a crease;
        for (const ON_SubDFace* f = sit1.PrevFace(ON_SubDSectorIterator::StopAt::AnyCrease); nullptr != f && sid.m_sector_face_count <= vertex->m_face_count; f = sit1.PrevFace(ON_SubDSectorIterator::StopAt::AnyCrease))
        {
          ++sid.m_sector_face_count;
          if (f->m_id < sid.m_minimum_face_id)
            sid.m_minimum_face_id = f->m_id;
        }
        break;
      }
    }
    else
    {
      break;
    }

    if (0 == sid.m_sector_face_count)
    {
      // we can avoid expensive sector iterator.
      unsigned int crease_count = 0;
      const ON_SubDFace* f;
      for (unsigned short vei = 0; vei < vertex->m_edge_count; ++vei)
      {
        const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(vertex->m_edges[vei].m_ptr);
        if (nullptr == e || 0 == e->m_face_count)
          return ON_SubDSectorId::Invalid;
        f = ON_SUBD_FACE_POINTER(e->m_face2[0].m_ptr);
        if (nullptr == f)
          return ON_SubDSectorId::Invalid;
        if (f->m_id < sid.m_minimum_face_id)
          sid.m_minimum_face_id = f->m_id;
        if (ON_SubDEdgeTag::Crease == e->m_edge_tag)
        {
          ++crease_count;
          if (crease_count > expected_crease_count)
            return ON_SubDSectorId::Invalid;
          if (crease_face_count != e->m_face_count)
            return ON_SubDSectorId::Invalid;
          if (1 == crease_face_count)
            continue;
        }
        if (2 != e->m_face_count)
          return ON_SubDSectorId::Invalid;
        f = ON_SUBD_FACE_POINTER(e->m_face2[1].m_ptr);
        if (nullptr == f)
          return ON_SubDSectorId::Invalid;
        if (f->m_id < sid.m_minimum_face_id)
          sid.m_minimum_face_id = f->m_id;
      }
      if (crease_count == expected_crease_count)
        sid.m_sector_face_count = n;
    }
    break;
  }

  return (sid.IsSet() && sid.m_sector_face_count <= vertex->m_face_count) ? sid : ON_SubDSectorId::Invalid;
}